

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall Database::ExecuteFile(Database *this,string *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  char *p;
  _Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *this_00;
  _Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *p_Var4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string query;
  char buf [4096];
  
  queries.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  queries.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&queries;
  queries.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&queries;
  __stream = fopen((filename->_M_dataplus)._M_p,"rt");
LAB_00124c7e:
  pcVar3 = fgets(buf,0x1000,__stream);
  if ((pcVar3 != (char *)0x0) && (iVar2 = feof(__stream), pcVar3 = buf, iVar2 == 0)) {
    do {
      if (*pcVar3 == ';') {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&queries,&query);
        std::__cxx11::string::erase((ulong)&query,0);
      }
      else {
        if (*pcVar3 == '\0') goto LAB_00124c7e;
        std::__cxx11::string::push_back((char)&query);
      }
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  fclose(__stream);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&queries,&query);
  __it._M_node = (_List_node_base *)0x0;
  std::__cxx11::string::erase((ulong)&query,0);
  this_00 = (_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *)&queries;
  do {
    this_00 = *(_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> **)this_00;
    if (this_00 == (_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *)&queries)
    goto LAB_00124d48;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::$_0>::
            operator()(this_00,__it);
  } while (!bVar1);
  p_Var4 = this_00;
  while (this_00 = *(_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> **)this_00,
        this_00 != (_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *)&queries)
  {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::$_0>::
            operator()(this_00,__it);
    if (!bVar1) {
      __it._M_node = (_List_node_base *)(this_00 + 0x10);
      std::__cxx11::string::operator=((string *)(p_Var4 + 0x10),(string *)__it._M_node);
      p_Var4 = *(_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> **)p_Var4;
    }
  }
LAB_00124d48:
  ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
            (this,(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )queries.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&queries);
  std::__cxx11::string::~string((string *)&query);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&queries.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

void Database::ExecuteFile(const std::string& filename)
{
	std::list<std::string> queries;
	std::string query;

	FILE* fh = std::fopen(filename.c_str(), "rt");

	try
	{
		while (true)
		{
			char buf[4096];

			const char *result = std::fgets(buf, 4096, fh);

			if (!result || std::feof(fh))
				break;

			for (char* p = buf; *p != '\0'; ++p)
			{
				if (*p == ';')
				{
					queries.push_back(query);
					query.erase();
				}
				else
				{
					query += *p;
				}
			}
		}
	}
	catch (std::exception &e)
	{
		std::fclose(fh);
		throw;
	}

	std::fclose(fh);

	queries.push_back(query);
	query.erase();

	std::remove_if(UTIL_RANGE(queries), [&](const std::string& s) { return util::trim(s).length() == 0; });

	this->ExecuteQueries(UTIL_RANGE(queries));
}